

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O0

int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem,uchar *pub,size_t *size,int compressed)

{
  undefined1 uVar1;
  int iVar2;
  int in_ECX;
  undefined8 *in_RDX;
  undefined1 *in_RSI;
  secp256k1_fe *in_RDI;
  int local_4;
  
  iVar2 = secp256k1_ge_is_infinity((secp256k1_ge *)0x472271);
  if (iVar2 == 0) {
    secp256k1_fe_impl_normalize_var(in_RDI);
    secp256k1_fe_impl_normalize_var(in_RDI + 1);
    secp256k1_fe_impl_get_b32(in_RSI + 1,in_RDI);
    if (in_ECX == 0) {
      *in_RDX = 0x41;
      *in_RSI = 4;
      secp256k1_fe_impl_get_b32(in_RSI + 0x21,in_RDI + 1);
    }
    else {
      *in_RDX = 0x21;
      iVar2 = secp256k1_fe_impl_is_odd(in_RDI + 1);
      uVar1 = 2;
      if (iVar2 != 0) {
        uVar1 = 3;
      }
      *in_RSI = uVar1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem, unsigned char *pub, size_t *size, int compressed) {
    if (secp256k1_ge_is_infinity(elem)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&elem->x);
    secp256k1_fe_normalize_var(&elem->y);
    secp256k1_fe_get_b32(&pub[1], &elem->x);
    if (compressed) {
        *size = 33;
        pub[0] = secp256k1_fe_is_odd(&elem->y) ? SECP256K1_TAG_PUBKEY_ODD : SECP256K1_TAG_PUBKEY_EVEN;
    } else {
        *size = 65;
        pub[0] = SECP256K1_TAG_PUBKEY_UNCOMPRESSED;
        secp256k1_fe_get_b32(&pub[33], &elem->y);
    }
    return 1;
}